

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImgDisplay * __thiscall
cimg_library::CImgDisplay::render<unsigned_char>
          (CImgDisplay *this,CImg<unsigned_char> *img,bool flag8)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  bool bVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  uchar *puVar10;
  CImgArgumentException *this_00;
  X11_static *pXVar11;
  CImg<unsigned_char> *img_00;
  char *pcVar12;
  char *pcVar13;
  ulong uVar14;
  byte *pbVar15;
  undefined4 uVar16;
  uint *local_498;
  unsigned_short *local_478;
  uchar *local_458;
  float local_44c;
  uint *local_428;
  unsigned_short *local_408;
  uchar *local_3e8;
  uchar *local_3d0;
  uchar *local_3c8;
  char *local_380;
  char local_359;
  long local_350;
  unsigned_long xy_29;
  unsigned_long xy_28;
  unsigned_long xy_27;
  unsigned_long xy_26;
  long lStack_328;
  uchar val_7;
  unsigned_long xy_25;
  long lStack_318;
  uchar val_6;
  unsigned_long xy_24;
  uint *ptrd_5;
  uint *ndata_5;
  long lStack_2e0;
  uchar G_15;
  unsigned_long xy_23;
  long lStack_2d0;
  uchar G_14;
  unsigned_long xy_22;
  long lStack_2c0;
  uchar G_13;
  unsigned_long xy_21;
  long lStack_2b0;
  uchar G_12;
  unsigned_long xy_20;
  uchar G_11;
  long lStack_2a0;
  uchar val_5;
  unsigned_long xy_19;
  uchar G_10;
  long lStack_290;
  uchar val_4;
  unsigned_long xy_18;
  unsigned_short *puStack_280;
  uint M_1;
  uchar *ptrd_4;
  unsigned_short *ndata_4;
  uchar B_1;
  uchar G_9;
  long lStack_250;
  uchar R_4;
  unsigned_long xy_17;
  uchar G_8;
  long lStack_240;
  uchar R_3;
  unsigned_long xy_16;
  long lStack_230;
  uchar R_2;
  unsigned_long xy_15;
  uchar *ptrd_3;
  uchar *ndata_3;
  float mm;
  float delta;
  unsigned_long xy_14;
  unsigned_long xy_13;
  unsigned_long xy_12;
  unsigned_long xy_11;
  long lStack_1d0;
  uchar val_3;
  unsigned_long xy_10;
  long lStack_1c0;
  uchar val_2;
  unsigned_long xy_9;
  uint *ptrd_2;
  uint *ndata_2;
  long lStack_188;
  uchar G_7;
  unsigned_long xy_8;
  long lStack_178;
  uchar G_6;
  unsigned_long xy_7;
  long lStack_168;
  uchar G_5;
  unsigned_long xy_6;
  long lStack_158;
  uchar G_4;
  unsigned_long xy_5;
  uchar G_3;
  long lStack_148;
  uchar val_1;
  unsigned_long xy_4;
  uchar G_2;
  long lStack_138;
  uchar val;
  unsigned_long xy_3;
  unsigned_short *puStack_128;
  uint M;
  uchar *ptrd_1;
  unsigned_short *ndata_1;
  uchar B;
  uchar G_1;
  long lStack_f8;
  uchar R_1;
  unsigned_long xy_2;
  uchar G;
  long lStack_e8;
  uchar R;
  unsigned_long xy_1;
  unsigned_long xy;
  uchar *ptrd;
  uchar *ndata;
  uchar *data3;
  uchar *data2;
  uchar *data1;
  CImg<unsigned_char> local_78;
  CImg<unsigned_char> local_58;
  byte local_21;
  CImg<unsigned_char> *pCStack_20;
  bool flag8_local;
  CImg<unsigned_char> *img_local;
  CImgDisplay *this_local;
  
  local_21 = flag8;
  pCStack_20 = img;
  img_local = (CImg<unsigned_char> *)this;
  puVar10 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)img);
  if (puVar10 == (uchar *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    local_359 = '\"';
    if (this->_title == (char *)0x0) {
      local_359 = '[';
    }
    if (this->_title == (char *)0x0) {
      local_380 = "untitled";
    }
    else {
      local_380 = this->_title;
    }
    uVar16 = 0x5d;
    if (this->_title != (char *)0x0) {
      uVar16 = 0x22;
    }
    CImgArgumentException::CImgArgumentException
              (this_00,"[instance(%u,%u,%u,%c%s%c)] CImgDisplay::render(): Empty specified image.",
               (ulong)this->_width,(ulong)this->_height,(ulong)this->_normalization,
               (ulong)(uint)(int)local_359,local_380,uVar16);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,
                CImgArgumentException::~CImgArgumentException);
  }
  bVar5 = is_empty(this);
  if (bVar5) {
    return this;
  }
  if (pCStack_20->_depth != 1) {
    CImg<unsigned_char>::get_projections2d
              (&local_58,pCStack_20,pCStack_20->_width - 1 >> 1,pCStack_20->_height - 1 >> 1,
               pCStack_20->_depth - 1 >> 1);
    this_local = render<unsigned_char>(this,&local_58,false);
    CImg<unsigned_char>::~CImg(&local_58);
    return this_local;
  }
  pXVar11 = cimg::X11_attr();
  if ((pXVar11->nb_bits == 8) &&
     ((pCStack_20->_width != this->_width || (pCStack_20->_height != this->_height)))) {
    CImg<unsigned_char>::get_resize
              (&local_78,pCStack_20,this->_width,this->_height,1,-100,1,0,0.0,0.0,0.0,0.0);
    this_local = render<unsigned_char>(this,&local_78,false);
    CImg<unsigned_char>::~CImg(&local_78);
    return this_local;
  }
  pXVar11 = cimg::X11_attr();
  if (((pXVar11->nb_bits == 8) && ((local_21 & 1) == 0)) && (pCStack_20->_spectrum == 3)) {
    if ((render<unsigned_char>(cimg_library::CImg<unsigned_char>const&,bool)::default_colormap ==
         '\0') &&
       (iVar8 = __cxa_guard_acquire(&render<unsigned_char>(cimg_library::CImg<unsigned_char>const&,bool)
                                     ::default_colormap), iVar8 != 0)) {
      img_00 = CImg<unsigned_char>::default_LUT256();
      CImg<unsigned_char>::CImg(&render<unsigned_char>::default_colormap,img_00);
      __cxa_atexit(CImg<unsigned_char>::~CImg,&render<unsigned_char>::default_colormap,&__dso_handle
                  );
      __cxa_guard_release(&render<unsigned_char>(cimg_library::CImg<unsigned_char>const&,bool)::
                           default_colormap);
    }
    CImg<unsigned_char>::get_index<unsigned_char>
              ((CImg<unsigned_int> *)&data1,pCStack_20,&render<unsigned_char>::default_colormap,1.0,
               false);
    this_local = render<unsigned_int>(this,(CImg<unsigned_int> *)&data1,false);
    CImg<unsigned_int>::~CImg((CImg<unsigned_int> *)&data1);
    return this_local;
  }
  local_3c8 = pCStack_20->_data;
  data2 = local_3c8;
  if (1 < pCStack_20->_spectrum) {
    local_3c8 = CImg<unsigned_char>::data(pCStack_20,0,0,0,1);
  }
  data3 = local_3c8;
  if (pCStack_20->_spectrum < 3) {
    local_3d0 = data2;
  }
  else {
    local_3d0 = CImg<unsigned_char>::data(pCStack_20,0,0,0,2);
  }
  ndata = local_3d0;
  pXVar11 = cimg::X11_attr();
  if ((pXVar11->is_blue_first & 1U) != 0) {
    cimg::swap<unsigned_char_const*>(&data2,&ndata);
  }
  cimg::mutex(0xf,1);
  if (this->_normalization == 0) {
LAB_001cd9bb:
    this->_max = 0.0;
    this->_min = 0.0;
    pXVar11 = cimg::X11_attr();
    if (pXVar11->nb_bits == 8) {
      _set_colormap(this,&this->_colormap,pCStack_20->_spectrum);
      if ((pCStack_20->_width == this->_width) && (pCStack_20->_height == this->_height)) {
        local_3e8 = (uchar *)this->_data;
      }
      else {
        local_3e8 = (uchar *)operator_new__((ulong)pCStack_20->_width * (ulong)pCStack_20->_height);
      }
      xy = (unsigned_long)local_3e8;
      if (pCStack_20->_spectrum == 1) {
        for (xy_1 = (ulong)pCStack_20->_width * (ulong)pCStack_20->_height; xy_1 != 0;
            xy_1 = xy_1 - 1) {
          *(uchar *)xy = *data2;
          xy = xy + 1;
          data2 = data2 + 1;
        }
      }
      else if (pCStack_20->_spectrum == 2) {
        for (lStack_e8 = (ulong)pCStack_20->_width * (ulong)pCStack_20->_height; lStack_e8 != 0;
            lStack_e8 = lStack_e8 + -1) {
          *(byte *)xy = *data2 & 0xf0 | (byte)((int)(uint)*data3 >> 4);
          xy = xy + 1;
          data3 = data3 + 1;
          data2 = data2 + 1;
        }
      }
      else {
        for (lStack_f8 = (ulong)pCStack_20->_width * (ulong)pCStack_20->_height; lStack_f8 != 0;
            lStack_f8 = lStack_f8 + -1) {
          *(byte *)xy = *data2 & 0xe0 | (byte)(((int)(uint)*data3 >> 5) << 2) |
                        (byte)((int)(uint)*ndata >> 6);
          xy = xy + 1;
          ndata = ndata + 1;
          data3 = data3 + 1;
          data2 = data2 + 1;
        }
      }
      if ((local_3e8 != (uchar *)this->_data) &&
         (_render_resize<unsigned_char,unsigned_char>
                    (local_3e8,pCStack_20->_width,pCStack_20->_height,(uchar *)this->_data,
                     this->_width,this->_height), local_3e8 != (uchar *)0x0)) {
        operator_delete__(local_3e8);
      }
    }
    else if (pXVar11->nb_bits == 0x10) {
      if ((pCStack_20->_width == this->_width) && (pCStack_20->_height == this->_height)) {
        local_408 = (unsigned_short *)this->_data;
      }
      else {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (ulong)pCStack_20->_width * (ulong)pCStack_20->_height;
        uVar14 = SUB168(auVar1 * ZEXT816(2),0);
        if (SUB168(auVar1 * ZEXT816(2),8) != 0) {
          uVar14 = 0xffffffffffffffff;
        }
        local_408 = (unsigned_short *)operator_new__(uVar14);
      }
      puStack_128 = local_408;
      if (pCStack_20->_spectrum == 1) {
        pXVar11 = cimg::X11_attr();
        if ((pXVar11->byte_order & 1U) == 0) {
          for (lStack_148 = (ulong)pCStack_20->_width * (ulong)pCStack_20->_height; lStack_148 != 0;
              lStack_148 = lStack_148 + -1) {
            bVar7 = *data2;
            uVar9 = (uint)bVar7;
            *(byte *)puStack_128 = (char)((int)uVar9 >> 2) << 5 | (byte)((int)uVar9 >> 3);
            *(byte *)((long)puStack_128 + 1) = bVar7 & 0xf8 | (byte)((int)uVar9 >> 5);
            puStack_128 = puStack_128 + 1;
            data2 = data2 + 1;
          }
        }
        else {
          for (lStack_138 = (ulong)pCStack_20->_width * (ulong)pCStack_20->_height; lStack_138 != 0;
              lStack_138 = lStack_138 + -1) {
            uVar9 = (uint)*data2;
            *(byte *)puStack_128 = *data2 & 0xf8 | (byte)((int)uVar9 >> 5);
            *(byte *)((long)puStack_128 + 1) =
                 (char)((int)uVar9 >> 2) << 5 | (byte)((int)uVar9 >> 3);
            puStack_128 = puStack_128 + 1;
            data2 = data2 + 1;
          }
        }
      }
      else if (pCStack_20->_spectrum == 2) {
        pXVar11 = cimg::X11_attr();
        if ((pXVar11->byte_order & 1U) == 0) {
          for (lStack_168 = (ulong)pCStack_20->_width * (ulong)pCStack_20->_height; lStack_168 != 0;
              lStack_168 = lStack_168 + -1) {
            bVar7 = *data3;
            *(char *)puStack_128 = (char)((int)(uint)bVar7 >> 2) << 5;
            *(byte *)((long)puStack_128 + 1) = *data2 & 0xf8 | (byte)((int)(uint)bVar7 >> 5);
            puStack_128 = puStack_128 + 1;
            data3 = data3 + 1;
            data2 = data2 + 1;
          }
        }
        else {
          for (lStack_158 = (ulong)pCStack_20->_width * (ulong)pCStack_20->_height; lStack_158 != 0;
              lStack_158 = lStack_158 + -1) {
            bVar7 = *data3;
            *(byte *)puStack_128 = *data2 & 0xf8 | (byte)((int)(uint)bVar7 >> 5);
            *(char *)((long)puStack_128 + 1) = (char)((int)(uint)bVar7 >> 2) << 5;
            puStack_128 = puStack_128 + 1;
            data3 = data3 + 1;
            data2 = data2 + 1;
          }
        }
      }
      else {
        pXVar11 = cimg::X11_attr();
        if ((pXVar11->byte_order & 1U) == 0) {
          for (lStack_188 = (ulong)pCStack_20->_width * (ulong)pCStack_20->_height; lStack_188 != 0;
              lStack_188 = lStack_188 + -1) {
            bVar7 = *data3;
            *(byte *)puStack_128 =
                 (char)((int)(uint)bVar7 >> 2) << 5 | (byte)((int)(uint)*ndata >> 3);
            *(byte *)((long)puStack_128 + 1) = *data2 & 0xf8 | (byte)((int)(uint)bVar7 >> 5);
            puStack_128 = puStack_128 + 1;
            ndata = ndata + 1;
            data3 = data3 + 1;
            data2 = data2 + 1;
          }
        }
        else {
          for (lStack_178 = (ulong)pCStack_20->_width * (ulong)pCStack_20->_height; lStack_178 != 0;
              lStack_178 = lStack_178 + -1) {
            bVar7 = *data3;
            *(byte *)puStack_128 = *data2 & 0xf8 | (byte)((int)(uint)bVar7 >> 5);
            *(byte *)((long)puStack_128 + 1) =
                 (char)((int)(uint)bVar7 >> 2) << 5 | (byte)((int)(uint)*ndata >> 3);
            puStack_128 = puStack_128 + 1;
            ndata = ndata + 1;
            data3 = data3 + 1;
            data2 = data2 + 1;
          }
        }
      }
      if ((local_408 != (unsigned_short *)this->_data) &&
         (_render_resize<unsigned_short,unsigned_short>
                    (local_408,pCStack_20->_width,pCStack_20->_height,(unsigned_short *)this->_data,
                     this->_width,this->_height), local_408 != (unsigned_short *)0x0)) {
        operator_delete__(local_408);
      }
    }
    else {
      if ((pCStack_20->_width == this->_width) && (pCStack_20->_height == this->_height)) {
        local_428 = (uint *)this->_data;
      }
      else {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (ulong)pCStack_20->_width * (ulong)pCStack_20->_height;
        uVar14 = SUB168(auVar2 * ZEXT816(4),0);
        if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
          uVar14 = 0xffffffffffffffff;
        }
        local_428 = (uint *)operator_new__(uVar14);
      }
      xy_9 = (unsigned_long)local_428;
      if (pCStack_20->_spectrum == 1) {
        pXVar11 = cimg::X11_attr();
        bVar5 = pXVar11->byte_order;
        bVar6 = cimg::endianness();
        if ((bool)(bVar5 & 1U) == bVar6) {
          for (lStack_1c0 = (ulong)pCStack_20->_width * (ulong)pCStack_20->_height; lStack_1c0 != 0;
              lStack_1c0 = lStack_1c0 + -1) {
            bVar7 = *data2;
            *(uint *)xy_9 = (uint)bVar7 << 0x10 | (uint)bVar7 << 8 | (uint)bVar7;
            xy_9 = xy_9 + 4;
            data2 = data2 + 1;
          }
        }
        else {
          for (lStack_1d0 = (ulong)pCStack_20->_width * (ulong)pCStack_20->_height; lStack_1d0 != 0;
              lStack_1d0 = lStack_1d0 + -1) {
            bVar7 = *data2;
            *(uint *)xy_9 = (uint)bVar7 << 0x10 | (uint)bVar7 << 8 | (uint)bVar7;
            xy_9 = xy_9 + 4;
            data2 = data2 + 1;
          }
        }
      }
      else if (pCStack_20->_spectrum == 2) {
        pXVar11 = cimg::X11_attr();
        bVar5 = pXVar11->byte_order;
        bVar6 = cimg::endianness();
        if ((bool)(bVar5 & 1U) == bVar6) {
          for (xy_12 = (ulong)pCStack_20->_width * (ulong)pCStack_20->_height; xy_12 != 0;
              xy_12 = xy_12 - 1) {
            *(uint *)xy_9 = (uint)*data2 << 0x10 | (uint)*data3 << 8;
            xy_9 = xy_9 + 4;
            data3 = data3 + 1;
            data2 = data2 + 1;
          }
        }
        else {
          for (xy_13 = (ulong)pCStack_20->_width * (ulong)pCStack_20->_height; xy_13 != 0;
              xy_13 = xy_13 - 1) {
            *(uint *)xy_9 = (uint)*data3 << 0x10 | (uint)*data2 << 8;
            xy_9 = xy_9 + 4;
            data3 = data3 + 1;
            data2 = data2 + 1;
          }
        }
      }
      else {
        pXVar11 = cimg::X11_attr();
        bVar5 = pXVar11->byte_order;
        bVar6 = cimg::endianness();
        if ((bool)(bVar5 & 1U) == bVar6) {
          for (xy_14 = (ulong)pCStack_20->_width * (ulong)pCStack_20->_height; xy_14 != 0;
              xy_14 = xy_14 - 1) {
            *(uint *)xy_9 = (uint)*data2 << 0x10 | (uint)*data3 << 8 | (uint)*ndata;
            xy_9 = xy_9 + 4;
            ndata = ndata + 1;
            data3 = data3 + 1;
            data2 = data2 + 1;
          }
        }
        else {
          for (_mm = (ulong)pCStack_20->_width * (ulong)pCStack_20->_height; _mm != 0;
              _mm = _mm + -1) {
            *(uint *)xy_9 = (uint)*ndata << 0x18 | (uint)*data3 << 0x10 | (uint)*data2 << 8;
            xy_9 = xy_9 + 4;
            ndata = ndata + 1;
            data3 = data3 + 1;
            data2 = data2 + 1;
          }
        }
      }
      if ((local_428 != (uint *)this->_data) &&
         (_render_resize<unsigned_int,unsigned_int>
                    (local_428,pCStack_20->_width,pCStack_20->_height,(uint *)this->_data,
                     this->_width,this->_height), local_428 != (uint *)0x0)) {
        operator_delete__(local_428);
      }
    }
  }
  else {
    if (this->_normalization == 3) {
      pcVar12 = cimg::type<unsigned_char>::string();
      pcVar13 = cimg::type<unsigned_char>::string();
      if (pcVar12 == pcVar13) goto LAB_001cd9bb;
    }
    if (this->_normalization == 3) {
      bVar5 = cimg::type<unsigned_char>::is_float();
      if (bVar5) {
        pbVar15 = CImg<unsigned_char>::min_max<float>(pCStack_20,&this->_max);
        this->_min = (float)*pbVar15;
      }
      else {
        bVar7 = cimg::type<unsigned_char>::min();
        this->_min = (float)bVar7;
        bVar7 = cimg::type<unsigned_char>::max();
        this->_max = (float)bVar7;
      }
    }
    else if ((this->_max <= this->_min && this->_min != this->_max) || (this->_normalization == 1))
    {
      pbVar15 = CImg<unsigned_char>::min_max<float>(pCStack_20,&this->_max);
      this->_min = (float)*pbVar15;
    }
    local_44c = this->_max - this->_min;
    if ((local_44c == 0.0) && (!NAN(local_44c))) {
      local_44c = 1.0;
    }
    local_44c = 255.0 / local_44c;
    pXVar11 = cimg::X11_attr();
    if (pXVar11->nb_bits == 8) {
      _set_colormap(this,&this->_colormap,pCStack_20->_spectrum);
      if ((pCStack_20->_width == this->_width) && (pCStack_20->_height == this->_height)) {
        local_458 = (uchar *)this->_data;
      }
      else {
        local_458 = (uchar *)operator_new__((ulong)pCStack_20->_width * (ulong)pCStack_20->_height);
      }
      xy_15 = (unsigned_long)local_458;
      if (pCStack_20->_spectrum == 1) {
        for (lStack_230 = (ulong)pCStack_20->_width * (ulong)pCStack_20->_height; lStack_230 != 0;
            lStack_230 = lStack_230 + -1) {
          *(char *)xy_15 = (char)(int)(((float)*data2 - this->_min) * local_44c);
          xy_15 = xy_15 + 1;
          data2 = data2 + 1;
        }
      }
      else if (pCStack_20->_spectrum == 2) {
        for (lStack_240 = (ulong)pCStack_20->_width * (ulong)pCStack_20->_height; lStack_240 != 0;
            lStack_240 = lStack_240 + -1) {
          *(byte *)xy_15 =
               (byte)(int)(((float)*data2 - this->_min) * local_44c) & 0xf0 |
               (byte)((int)((int)(((float)*data3 - this->_min) * local_44c) & 0xffU) >> 4);
          xy_15 = xy_15 + 1;
          data3 = data3 + 1;
          data2 = data2 + 1;
        }
      }
      else {
        for (lStack_250 = (ulong)pCStack_20->_width * (ulong)pCStack_20->_height; lStack_250 != 0;
            lStack_250 = lStack_250 + -1) {
          *(byte *)xy_15 =
               (byte)(int)(((float)*data2 - this->_min) * local_44c) & 0xe0 |
               (byte)(((int)((int)(((float)*data3 - this->_min) * local_44c) & 0xffU) >> 5) << 2) |
               (byte)((int)((int)(((float)*ndata - this->_min) * local_44c) & 0xffU) >> 6);
          xy_15 = xy_15 + 1;
          ndata = ndata + 1;
          data3 = data3 + 1;
          data2 = data2 + 1;
        }
      }
      if ((local_458 != (uchar *)this->_data) &&
         (_render_resize<unsigned_char,unsigned_char>
                    (local_458,pCStack_20->_width,pCStack_20->_height,(uchar *)this->_data,
                     this->_width,this->_height), local_458 != (uchar *)0x0)) {
        operator_delete__(local_458);
      }
    }
    else if (pXVar11->nb_bits == 0x10) {
      if ((pCStack_20->_width == this->_width) && (pCStack_20->_height == this->_height)) {
        local_478 = (unsigned_short *)this->_data;
      }
      else {
        auVar3._8_8_ = 0;
        auVar3._0_8_ = (ulong)pCStack_20->_width * (ulong)pCStack_20->_height;
        uVar14 = SUB168(auVar3 * ZEXT816(2),0);
        if (SUB168(auVar3 * ZEXT816(2),8) != 0) {
          uVar14 = 0xffffffffffffffff;
        }
        local_478 = (unsigned_short *)operator_new__(uVar14);
      }
      puStack_280 = local_478;
      if (pCStack_20->_spectrum == 1) {
        pXVar11 = cimg::X11_attr();
        if ((pXVar11->byte_order & 1U) == 0) {
          for (lStack_2a0 = (ulong)pCStack_20->_width * (ulong)pCStack_20->_height; lStack_2a0 != 0;
              lStack_2a0 = lStack_2a0 + -1) {
            uVar9 = (uint)(((float)*data2 - this->_min) * local_44c);
            *(byte *)puStack_280 =
                 (char)((int)(uVar9 & 0xff) >> 2) << 5 | (byte)((int)(uVar9 & 0xff) >> 3);
            *(byte *)((long)puStack_280 + 1) = (byte)uVar9 & 0xf8 | (byte)((int)(uVar9 & 0xff) >> 5)
            ;
            puStack_280 = puStack_280 + 1;
            data2 = data2 + 1;
          }
        }
        else {
          for (lStack_290 = (ulong)pCStack_20->_width * (ulong)pCStack_20->_height; lStack_290 != 0;
              lStack_290 = lStack_290 + -1) {
            uVar9 = (uint)(((float)*data2 - this->_min) * local_44c);
            *(byte *)puStack_280 = (byte)uVar9 & 0xf8 | (byte)((int)(uVar9 & 0xff) >> 5);
            *(byte *)((long)puStack_280 + 1) =
                 (char)((int)(uVar9 & 0xff) >> 2) << 5 | (byte)((int)(uVar9 & 0xff) >> 3);
            puStack_280 = puStack_280 + 1;
            data2 = data2 + 1;
          }
        }
      }
      else if (pCStack_20->_spectrum == 2) {
        pXVar11 = cimg::X11_attr();
        if ((pXVar11->byte_order & 1U) == 0) {
          for (lStack_2c0 = (ulong)pCStack_20->_width * (ulong)pCStack_20->_height; lStack_2c0 != 0;
              lStack_2c0 = lStack_2c0 + -1) {
            uVar9 = ((int)(((float)*data3 - this->_min) * local_44c) & 0xffU) >> 2;
            *(char *)puStack_280 = (char)uVar9 << 5;
            *(byte *)((long)puStack_280 + 1) =
                 (byte)(int)(((float)*data2 - this->_min) * local_44c) & 0xf8 |
                 (byte)((int)uVar9 >> 3);
            puStack_280 = puStack_280 + 1;
            data3 = data3 + 1;
            data2 = data2 + 1;
          }
        }
        else {
          for (lStack_2b0 = (ulong)pCStack_20->_width * (ulong)pCStack_20->_height; lStack_2b0 != 0;
              lStack_2b0 = lStack_2b0 + -1) {
            uVar9 = ((int)(((float)*data3 - this->_min) * local_44c) & 0xffU) >> 2;
            *(byte *)puStack_280 =
                 (byte)(int)(((float)*data2 - this->_min) * local_44c) & 0xf8 |
                 (byte)((int)uVar9 >> 3);
            *(char *)((long)puStack_280 + 1) = (char)uVar9 << 5;
            puStack_280 = puStack_280 + 1;
            data3 = data3 + 1;
            data2 = data2 + 1;
          }
        }
      }
      else {
        pXVar11 = cimg::X11_attr();
        if ((pXVar11->byte_order & 1U) == 0) {
          for (lStack_2e0 = (ulong)pCStack_20->_width * (ulong)pCStack_20->_height; lStack_2e0 != 0;
              lStack_2e0 = lStack_2e0 + -1) {
            uVar9 = ((int)(((float)*data3 - this->_min) * local_44c) & 0xffU) >> 2;
            *(byte *)puStack_280 =
                 (char)uVar9 << 5 |
                 (byte)(((int)(((float)*ndata - this->_min) * local_44c) & 0xffU) >> 3);
            *(byte *)((long)puStack_280 + 1) =
                 (byte)(int)(((float)*data2 - this->_min) * local_44c) & 0xf8 |
                 (byte)((int)uVar9 >> 3);
            puStack_280 = puStack_280 + 1;
            ndata = ndata + 1;
            data3 = data3 + 1;
            data2 = data2 + 1;
          }
        }
        else {
          for (lStack_2d0 = (ulong)pCStack_20->_width * (ulong)pCStack_20->_height; lStack_2d0 != 0;
              lStack_2d0 = lStack_2d0 + -1) {
            bVar7 = (byte)(((int)(((float)*data3 - this->_min) * local_44c) & 0xffU) >> 2);
            *(byte *)puStack_280 =
                 (byte)(int)(((float)*data2 - this->_min) * local_44c) & 0xf8 | bVar7 >> 3;
            *(byte *)((long)puStack_280 + 1) =
                 bVar7 << 5 |
                 (byte)((int)((int)(((float)*ndata - this->_min) * local_44c) & 0xffU) >> 3);
            puStack_280 = puStack_280 + 1;
            ndata = ndata + 1;
            data3 = data3 + 1;
            data2 = data2 + 1;
          }
        }
      }
      if ((local_478 != (unsigned_short *)this->_data) &&
         (_render_resize<unsigned_short,unsigned_short>
                    (local_478,pCStack_20->_width,pCStack_20->_height,(unsigned_short *)this->_data,
                     this->_width,this->_height), local_478 != (unsigned_short *)0x0)) {
        operator_delete__(local_478);
      }
    }
    else {
      if ((pCStack_20->_width == this->_width) && (pCStack_20->_height == this->_height)) {
        local_498 = (uint *)this->_data;
      }
      else {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = (ulong)pCStack_20->_width * (ulong)pCStack_20->_height;
        uVar14 = SUB168(auVar4 * ZEXT816(4),0);
        if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
          uVar14 = 0xffffffffffffffff;
        }
        local_498 = (uint *)operator_new__(uVar14);
      }
      xy_24 = (unsigned_long)local_498;
      if (pCStack_20->_spectrum == 1) {
        pXVar11 = cimg::X11_attr();
        bVar5 = pXVar11->byte_order;
        bVar6 = cimg::endianness();
        if ((bool)(bVar5 & 1U) == bVar6) {
          for (lStack_318 = (ulong)pCStack_20->_width * (ulong)pCStack_20->_height; lStack_318 != 0;
              lStack_318 = lStack_318 + -1) {
            uVar9 = (uint)(((float)*data2 - this->_min) * local_44c);
            *(uint *)xy_24 = (uVar9 & 0xff) << 0x10 | (uVar9 & 0xff) << 8 | uVar9 & 0xff;
            xy_24 = xy_24 + 4;
            data2 = data2 + 1;
          }
        }
        else {
          for (lStack_328 = (ulong)pCStack_20->_width * (ulong)pCStack_20->_height; lStack_328 != 0;
              lStack_328 = lStack_328 + -1) {
            uVar9 = (uint)(((float)*data2 - this->_min) * local_44c);
            *(uint *)xy_24 = uVar9 << 0x18 | (uVar9 & 0xff) << 0x10 | (uVar9 & 0xff) << 8;
            xy_24 = xy_24 + 4;
            data2 = data2 + 1;
          }
        }
      }
      else if (pCStack_20->_spectrum == 2) {
        pXVar11 = cimg::X11_attr();
        bVar5 = pXVar11->byte_order;
        bVar6 = cimg::endianness();
        if ((bool)(bVar5 & 1U) == bVar6) {
          for (xy_27 = (ulong)pCStack_20->_width * (ulong)pCStack_20->_height; xy_27 != 0;
              xy_27 = xy_27 - 1) {
            *(uint *)xy_24 =
                 ((int)(((float)*data2 - this->_min) * local_44c) & 0xffU) << 0x10 |
                 ((int)(((float)*data3 - this->_min) * local_44c) & 0xffU) << 8;
            xy_24 = xy_24 + 4;
            data3 = data3 + 1;
            data2 = data2 + 1;
          }
        }
        else {
          for (xy_28 = (ulong)pCStack_20->_width * (ulong)pCStack_20->_height; xy_28 != 0;
              xy_28 = xy_28 - 1) {
            *(uint *)xy_24 =
                 ((int)(((float)*data3 - this->_min) * local_44c) & 0xffU) << 0x10 |
                 ((int)(((float)*data2 - this->_min) * local_44c) & 0xffU) << 8;
            xy_24 = xy_24 + 4;
            data3 = data3 + 1;
            data2 = data2 + 1;
          }
        }
      }
      else {
        pXVar11 = cimg::X11_attr();
        bVar5 = pXVar11->byte_order;
        bVar6 = cimg::endianness();
        if ((bool)(bVar5 & 1U) == bVar6) {
          for (xy_29 = (ulong)pCStack_20->_width * (ulong)pCStack_20->_height; xy_29 != 0;
              xy_29 = xy_29 - 1) {
            *(uint *)xy_24 =
                 ((int)(((float)*data2 - this->_min) * local_44c) & 0xffU) << 0x10 |
                 ((int)(((float)*data3 - this->_min) * local_44c) & 0xffU) << 8 |
                 (int)(((float)*ndata - this->_min) * local_44c) & 0xffU;
            xy_24 = xy_24 + 4;
            ndata = ndata + 1;
            data3 = data3 + 1;
            data2 = data2 + 1;
          }
        }
        else {
          for (local_350 = (ulong)pCStack_20->_width * (ulong)pCStack_20->_height; local_350 != 0;
              local_350 = local_350 + -1) {
            *(uint *)xy_24 =
                 (int)(((float)*ndata - this->_min) * local_44c) << 0x18 |
                 ((int)(((float)*data3 - this->_min) * local_44c) & 0xffU) << 0x10 |
                 ((int)(((float)*data2 - this->_min) * local_44c) & 0xffU) << 8;
            xy_24 = xy_24 + 4;
            ndata = ndata + 1;
            data3 = data3 + 1;
            data2 = data2 + 1;
          }
        }
      }
      if ((local_498 != (uint *)this->_data) &&
         (_render_resize<unsigned_int,unsigned_int>
                    (local_498,pCStack_20->_width,pCStack_20->_height,(uint *)this->_data,
                     this->_width,this->_height), local_498 != (uint *)0x0)) {
        operator_delete__(local_498);
      }
    }
  }
  cimg::mutex(0xf,0);
  return this;
}

Assistant:

CImgDisplay& render(const CImg<T>& img, const bool flag8=false) {
      if (!img)
        throw CImgArgumentException(_cimgdisplay_instance
                                    "render(): Empty specified image.",
                                    cimgdisplay_instance);
      if (is_empty()) return *this;
      if (img._depth!=1) return render(img.get_projections2d((img._width - 1)/2,(img._height - 1)/2,
                                                             (img._depth - 1)/2));
      if (cimg::X11_attr().nb_bits==8 && (img._width!=_width || img._height!=_height))
        return render(img.get_resize(_width,_height,1,-100,1));
      if (cimg::X11_attr().nb_bits==8 && !flag8 && img._spectrum==3) {
        static const CImg<typename CImg<T>::ucharT> default_colormap = CImg<typename CImg<T>::ucharT>::default_LUT256();
        return render(img.get_index(default_colormap,1,false));
      }

      const T
        *data1 = img._data,
        *data2 = (img._spectrum>1)?img.data(0,0,0,1):data1,
        *data3 = (img._spectrum>2)?img.data(0,0,0,2):data1;

      if (cimg::X11_attr().is_blue_first) cimg::swap(data1,data3);
      cimg_lock_display();

      if (!_normalization || (_normalization==3 && cimg::type<T>::string()==cimg::type<unsigned char>::string())) {
        _min = _max = 0;
        switch (cimg::X11_attr().nb_bits) {
        case 8 : { // 256 colormap, no normalization
          _set_colormap(_colormap,img._spectrum);
          unsigned char
            *const ndata = (img._width==_width && img._height==_height)?(unsigned char*)_data:
            new unsigned char[(size_t)img._width*img._height],
            *ptrd = (unsigned char*)ndata;
          switch (img._spectrum) {
          case 1 :
            for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy)
              (*ptrd++) = (unsigned char)*(data1++);
            break;
          case 2 : for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
	      const unsigned char
                R = (unsigned char)*(data1++),
                G = (unsigned char)*(data2++);
	      (*ptrd++) = (R&0xf0) | (G>>4);
	    } break;
          default : for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
	      const unsigned char
                R = (unsigned char)*(data1++),
                G = (unsigned char)*(data2++),
                B = (unsigned char)*(data3++);
	      (*ptrd++) = (R&0xe0) | ((G>>5)<<2) | (B>>6);
	    }
          }
          if (ndata!=_data) {
            _render_resize(ndata,img._width,img._height,(unsigned char*)_data,_width,_height);
            delete[] ndata;
          }
        } break;
        case 16 : { // 16 bits colors, no normalization
          unsigned short *const ndata = (img._width==_width && img._height==_height)?(unsigned short*)_data:
            new unsigned short[(size_t)img._width*img._height];
          unsigned char *ptrd = (unsigned char*)ndata;
          const unsigned int M = 248;
          switch (img._spectrum) {
          case 1 :
            if (cimg::X11_attr().byte_order)
              for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                const unsigned char val = (unsigned char)*(data1++), G = val>>2;
                ptrd[0] = (val&M) | (G>>3);
                ptrd[1] = (G<<5) | (G>>1);
                ptrd+=2;
              } else for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                const unsigned char val = (unsigned char)*(data1++), G = val>>2;
                ptrd[0] = (G<<5) | (G>>1);
                ptrd[1] = (val&M) | (G>>3);
                ptrd+=2;
              }
            break;
          case 2 :
            if (cimg::X11_attr().byte_order)
              for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                const unsigned char G = (unsigned char)*(data2++)>>2;
                ptrd[0] = ((unsigned char)*(data1++)&M) | (G>>3);
                ptrd[1] = (G<<5);
                ptrd+=2;
              } else for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                const unsigned char G = (unsigned char)*(data2++)>>2;
                ptrd[0] = (G<<5);
                ptrd[1] = ((unsigned char)*(data1++)&M) | (G>>3);
                ptrd+=2;
              }
            break;
          default :
            if (cimg::X11_attr().byte_order)
              for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                const unsigned char G = (unsigned char)*(data2++)>>2;
                ptrd[0] = ((unsigned char)*(data1++)&M) | (G>>3);
                ptrd[1] = (G<<5) | ((unsigned char)*(data3++)>>3);
                ptrd+=2;
              } else for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                const unsigned char G = (unsigned char)*(data2++)>>2;
                ptrd[0] = (G<<5) | ((unsigned char)*(data3++)>>3);
                ptrd[1] = ((unsigned char)*(data1++)&M) | (G>>3);
                ptrd+=2;
              }
          }
          if (ndata!=_data) {
            _render_resize(ndata,img._width,img._height,(unsigned short*)_data,_width,_height);
            delete[] ndata;
          }
        } break;
        default : { // 24 bits colors, no normalization
          unsigned int *const ndata = (img._width==_width && img._height==_height)?(unsigned int*)_data:
            new unsigned int[(size_t)img._width*img._height];
          if (sizeof(int)==4) { // 32 bits int uses optimized version
            unsigned int *ptrd = ndata;
            switch (img._spectrum) {
            case 1 :
              if (cimg::X11_attr().byte_order==cimg::endianness())
                for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                  const unsigned char val = (unsigned char)*(data1++);
                  *(ptrd++) = (val<<16) | (val<<8) | val;
                }
              else
                for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                 const unsigned char val = (unsigned char)*(data1++);
                  *(ptrd++) = (val<<16) | (val<<8) | val;
                }
              break;
            case 2 :
              if (cimg::X11_attr().byte_order==cimg::endianness())
                for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy)
                  *(ptrd++) = ((unsigned char)*(data1++)<<16) | ((unsigned char)*(data2++)<<8);
              else
                for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy)
                  *(ptrd++) = ((unsigned char)*(data2++)<<16) | ((unsigned char)*(data1++)<<8);
              break;
            default :
              if (cimg::X11_attr().byte_order==cimg::endianness())
                for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy)
                  *(ptrd++) = ((unsigned char)*(data1++)<<16) | ((unsigned char)*(data2++)<<8) |
                    (unsigned char)*(data3++);
              else
                for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy)
                  *(ptrd++) = ((unsigned char)*(data3++)<<24) | ((unsigned char)*(data2++)<<16) |
                    ((unsigned char)*(data1++)<<8);
            }
          } else {
            unsigned char *ptrd = (unsigned char*)ndata;
            switch (img._spectrum) {
            case 1 :
              if (cimg::X11_attr().byte_order)
                for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                  ptrd[0] = 0;
                  ptrd[1] = (unsigned char)*(data1++);
                  ptrd[2] = 0;
                  ptrd[3] = 0;
                  ptrd+=4;
                } else for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                  ptrd[0] = 0;
                  ptrd[1] = 0;
                  ptrd[2] = (unsigned char)*(data1++);
                  ptrd[3] = 0;
                  ptrd+=4;
                }
              break;
            case 2 :
              if (cimg::X11_attr().byte_order) cimg::swap(data1,data2);
              for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                ptrd[0] = 0;
                ptrd[1] = (unsigned char)*(data2++);
                ptrd[2] = (unsigned char)*(data1++);
                ptrd[3] = 0;
                ptrd+=4;
              }
              break;
            default :
              if (cimg::X11_attr().byte_order)
                for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                  ptrd[0] = 0;
                  ptrd[1] = (unsigned char)*(data1++);
                  ptrd[2] = (unsigned char)*(data2++);
                  ptrd[3] = (unsigned char)*(data3++);
                  ptrd+=4;
                } else for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                  ptrd[0] = (unsigned char)*(data3++);
                  ptrd[1] = (unsigned char)*(data2++);
                  ptrd[2] = (unsigned char)*(data1++);
                  ptrd[3] = 0;
                  ptrd+=4;
                }
            }
          }
          if (ndata!=_data) {
            _render_resize(ndata,img._width,img._height,(unsigned int*)_data,_width,_height);
            delete[] ndata;
          }
        }
        }
      } else {
        if (_normalization==3) {
          if (cimg::type<T>::is_float()) _min = (float)img.min_max(_max);
          else { _min = (float)cimg::type<T>::min(); _max = (float)cimg::type<T>::max(); }
        } else if ((_min>_max) || _normalization==1) _min = (float)img.min_max(_max);
        const float delta = _max - _min, mm = 255/(delta?delta:1.f);
        switch (cimg::X11_attr().nb_bits) {
        case 8 : { // 256 colormap, with normalization
          _set_colormap(_colormap,img._spectrum);
          unsigned char *const ndata = (img._width==_width && img._height==_height)?(unsigned char*)_data:
            new unsigned char[(size_t)img._width*img._height];
          unsigned char *ptrd = (unsigned char*)ndata;
          switch (img._spectrum) {
          case 1 : for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
              const unsigned char R = (unsigned char)((*(data1++) - _min)*mm);
              *(ptrd++) = R;
            } break;
          case 2 : for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
              const unsigned char
                R = (unsigned char)((*(data1++) - _min)*mm),
                G = (unsigned char)((*(data2++) - _min)*mm);
            (*ptrd++) = (R&0xf0) | (G>>4);
          } break;
          default :
            for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
              const unsigned char
                R = (unsigned char)((*(data1++) - _min)*mm),
                G = (unsigned char)((*(data2++) - _min)*mm),
                B = (unsigned char)((*(data3++) - _min)*mm);
              *(ptrd++) = (R&0xe0) | ((G>>5)<<2) | (B>>6);
            }
          }
          if (ndata!=_data) {
            _render_resize(ndata,img._width,img._height,(unsigned char*)_data,_width,_height);
            delete[] ndata;
          }
        } break;
        case 16 : { // 16 bits colors, with normalization
          unsigned short *const ndata = (img._width==_width && img._height==_height)?(unsigned short*)_data:
            new unsigned short[(size_t)img._width*img._height];
          unsigned char *ptrd = (unsigned char*)ndata;
          const unsigned int M = 248;
          switch (img._spectrum) {
          case 1 :
            if (cimg::X11_attr().byte_order)
              for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                const unsigned char val = (unsigned char)((*(data1++) - _min)*mm), G = val>>2;
                ptrd[0] = (val&M) | (G>>3);
                ptrd[1] = (G<<5) | (val>>3);
                ptrd+=2;
              } else for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                const unsigned char val = (unsigned char)((*(data1++) - _min)*mm), G = val>>2;
                ptrd[0] = (G<<5) | (val>>3);
                ptrd[1] = (val&M) | (G>>3);
                ptrd+=2;
              }
            break;
          case 2 :
            if (cimg::X11_attr().byte_order)
              for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                const unsigned char G = (unsigned char)((*(data2++) - _min)*mm)>>2;
                ptrd[0] = ((unsigned char)((*(data1++) - _min)*mm)&M) | (G>>3);
                ptrd[1] = (G<<5);
                ptrd+=2;
              } else for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                const unsigned char G = (unsigned char)((*(data2++) - _min)*mm)>>2;
                ptrd[0] = (G<<5);
                ptrd[1] = ((unsigned char)((*(data1++) - _min)*mm)&M) | (G>>3);
                ptrd+=2;
              }
            break;
          default :
            if (cimg::X11_attr().byte_order)
              for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                const unsigned char G = (unsigned char)((*(data2++) - _min)*mm)>>2;
                ptrd[0] = ((unsigned char)((*(data1++) - _min)*mm)&M) | (G>>3);
                ptrd[1] = (G<<5) | ((unsigned char)((*(data3++) - _min)*mm)>>3);
                ptrd+=2;
              } else for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                const unsigned char G = (unsigned char)((*(data2++) - _min)*mm)>>2;
                ptrd[0] = (G<<5) | ((unsigned char)((*(data3++) - _min)*mm)>>3);
                ptrd[1] = ((unsigned char)((*(data1++) - _min)*mm)&M) | (G>>3);
                ptrd+=2;
              }
          }
          if (ndata!=_data) {
            _render_resize(ndata,img._width,img._height,(unsigned short*)_data,_width,_height);
            delete[] ndata;
          }
        } break;
        default : { // 24 bits colors, with normalization
          unsigned int *const ndata = (img._width==_width && img._height==_height)?(unsigned int*)_data:
            new unsigned int[(size_t)img._width*img._height];
          if (sizeof(int)==4) { // 32 bits int uses optimized version
            unsigned int *ptrd = ndata;
            switch (img._spectrum) {
            case 1 :
              if (cimg::X11_attr().byte_order==cimg::endianness())
                for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                  const unsigned char val = (unsigned char)((*(data1++) - _min)*mm);
                  *(ptrd++) = (val<<16) | (val<<8) | val;
                }
              else
                for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                  const unsigned char val = (unsigned char)((*(data1++) - _min)*mm);
                  *(ptrd++) = (val<<24) | (val<<16) | (val<<8);
                }
              break;
            case 2 :
              if (cimg::X11_attr().byte_order==cimg::endianness())
                for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy)
                  *(ptrd++) =
                    ((unsigned char)((*(data1++) - _min)*mm)<<16) |
                    ((unsigned char)((*(data2++) - _min)*mm)<<8);
              else
                for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy)
                  *(ptrd++) =
                    ((unsigned char)((*(data2++) - _min)*mm)<<16) |
                    ((unsigned char)((*(data1++) - _min)*mm)<<8);
              break;
            default :
              if (cimg::X11_attr().byte_order==cimg::endianness())
                for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy)
                  *(ptrd++) =
                    ((unsigned char)((*(data1++) - _min)*mm)<<16) |
                    ((unsigned char)((*(data2++) - _min)*mm)<<8) |
                    (unsigned char)((*(data3++) - _min)*mm);
              else
                for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy)
                  *(ptrd++) =
                    ((unsigned char)((*(data3++) - _min)*mm)<<24) |
                    ((unsigned char)((*(data2++) - _min)*mm)<<16) |
                    ((unsigned char)((*(data1++) - _min)*mm)<<8);
            }
          } else {
            unsigned char *ptrd = (unsigned char*)ndata;
            switch (img._spectrum) {
            case 1 :
              if (cimg::X11_attr().byte_order)
                for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                  const unsigned char val = (unsigned char)((*(data1++) - _min)*mm);
                  ptrd[0] = 0;
                  ptrd[1] = val;
                  ptrd[2] = val;
                  ptrd[3] = val;
                  ptrd+=4;
                } else for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                  const unsigned char val = (unsigned char)((*(data1++) - _min)*mm);
                  ptrd[0] = val;
                  ptrd[1] = val;
                  ptrd[2] = val;
                  ptrd[3] = 0;
                  ptrd+=4;
                }
              break;
            case 2 :
              if (cimg::X11_attr().byte_order) cimg::swap(data1,data2);
              for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                ptrd[0] = 0;
                ptrd[1] = (unsigned char)((*(data2++) - _min)*mm);
                ptrd[2] = (unsigned char)((*(data1++) - _min)*mm);
                ptrd[3] = 0;
                ptrd+=4;
              }
              break;
            default :
              if (cimg::X11_attr().byte_order)
                for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                  ptrd[0] = 0;
                  ptrd[1] = (unsigned char)((*(data1++) - _min)*mm);
                  ptrd[2] = (unsigned char)((*(data2++) - _min)*mm);
                  ptrd[3] = (unsigned char)((*(data3++) - _min)*mm);
                  ptrd+=4;
                } else for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                  ptrd[0] = (unsigned char)((*(data3++) - _min)*mm);
                  ptrd[1] = (unsigned char)((*(data2++) - _min)*mm);
                  ptrd[2] = (unsigned char)((*(data1++) - _min)*mm);
                  ptrd[3] = 0;
                  ptrd+=4;
                }
            }
          }
          if (ndata!=_data) {
            _render_resize(ndata,img._width,img._height,(unsigned int*)_data,_width,_height);
            delete[] ndata;
          }
	}
        }
      }
      cimg_unlock_display();
      return *this;
    }